

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_cgraph * ggml_new_graph_custom(ggml_context *ctx,size_t size,_Bool grads)

{
  ggml_tensor **ppgVar1;
  ggml_tensor **ppgVar2;
  ggml_tensor **ppgVar3;
  ggml_tensor **__s;
  size_t sVar4;
  ggml_object *pgVar5;
  ggml_tensor **ppgVar6;
  void *ptr;
  ggml_cgraph *pgVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ggml_tensor **ppgVar11;
  
  sVar4 = ggml_graph_nbytes(size,grads);
  pgVar5 = ggml_new_object(ctx,GGML_OBJECT_TYPE_GRAPH,sVar4);
  uVar10 = 0;
  uVar8 = 0x20;
  do {
    uVar9 = uVar8 + uVar10 >> 1;
    if (ggml_hash_size::primes[uVar9] < size * 2) {
      uVar10 = uVar9 + 1;
      uVar9 = uVar8;
    }
    uVar8 = uVar9;
  } while (uVar10 < uVar9);
  pgVar7 = (ggml_cgraph *)((long)ctx->mem_buffer + pgVar5->offs);
  if (uVar10 < 0x20) {
    sVar4 = ggml_hash_size::primes[uVar10];
  }
  else {
    sVar4 = size * 2 | 1;
  }
  ppgVar6 = (ggml_tensor **)((ulong)((long)&pgVar7[1].n_nodes + 3U) & 0xfffffffffffffff8);
  ppgVar1 = ppgVar6 + size;
  ppgVar2 = ppgVar1 + size + sVar4;
  ppgVar11 = ppgVar2 + sVar4;
  __s = ppgVar11 + sVar4;
  ppgVar3 = ppgVar2;
  if (!grads) {
    ppgVar11 = (ggml_tensor **)0x0;
    ppgVar3 = (ggml_tensor **)0x0;
    __s = ppgVar2;
  }
  pgVar7->size = (int)size;
  pgVar7->n_nodes = 0;
  pgVar7->n_leafs = 0;
  pgVar7->nodes = ppgVar6;
  pgVar7->grads = ppgVar3;
  pgVar7->grad_accs = ppgVar11;
  pgVar7->leafs = ppgVar1;
  (pgVar7->visited_hash_set).size = sVar4;
  (pgVar7->visited_hash_set).used = (ggml_bitset_t *)__s;
  (pgVar7->visited_hash_set).keys = ppgVar1 + size;
  pgVar7->order = GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT;
  memset(__s,0,sVar4 + 0x1f >> 3 & 0xfffffffffffffffc);
  if (grads) {
    memset(pgVar7->grads,0,sVar4 << 3);
    memset(pgVar7->grad_accs,0,sVar4 << 3);
  }
  return pgVar7;
}

Assistant:

struct ggml_cgraph * ggml_new_graph_custom(struct ggml_context * ctx, size_t size, bool grads) {
    const size_t obj_size = ggml_graph_nbytes(size, grads);
    struct ggml_object * obj = ggml_new_object(ctx, GGML_OBJECT_TYPE_GRAPH, obj_size);
    struct ggml_cgraph * cgraph = (struct ggml_cgraph *) ((char *) ctx->mem_buffer + obj->offs);

    // the size of the hash table is doubled since it needs to hold both nodes and leafs
    size_t hash_size = ggml_hash_size(size * 2);

    void * p = cgraph + 1;

    struct ggml_tensor ** nodes_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** leafs_ptr     =         incr_ptr_aligned(&p, size      * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** hash_keys_ptr =         incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *));
    struct ggml_tensor ** grads_ptr     = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;
    struct ggml_tensor ** grad_accs_ptr = grads ? incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)) : NULL;

    ggml_bitset_t * hash_used = incr_ptr_aligned(&p, ggml_bitset_size(hash_size) * sizeof(ggml_bitset_t), sizeof(ggml_bitset_t));

    // check that we allocated the correct amount of memory
    assert(obj_size == (size_t)((char *)p - (char *)cgraph));

    *cgraph = (struct ggml_cgraph) {
        /*.size         =*/ size,
        /*.n_nodes      =*/ 0,
        /*.n_leafs      =*/ 0,
        /*.nodes        =*/ nodes_ptr,
        /*.grads        =*/ grads_ptr,
        /*.grad_accs    =*/ grad_accs_ptr,
        /*.leafs        =*/ leafs_ptr,
        /*.hash_table   =*/ { hash_size, hash_used, hash_keys_ptr },
        /*.order        =*/ GGML_CGRAPH_EVAL_ORDER_LEFT_TO_RIGHT,
    };

    ggml_hash_set_reset(&cgraph->visited_hash_set);
    if (grads) {
        memset(cgraph->grads,     0, hash_size*sizeof(struct ggml_tensor *));
        memset(cgraph->grad_accs, 0, hash_size*sizeof(struct ggml_tensor *));
    }

    return cgraph;
}